

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ParseTopLevelStatement
          (Parser *this,FileDescriptorProto *file,LocationRecorder *root_location)

{
  bool bVar1;
  bool bVar2;
  DescriptorProto *message;
  EnumDescriptorProto *enum_type;
  ServiceDescriptorProto *service;
  FileOptions *options;
  FileDescriptorProto *in_RCX;
  FileDescriptorProto *in_R9;
  allocator local_49;
  LocationRecorder location;
  
  bVar1 = TryConsumeEndOfDeclaration(this,";",(LocationRecorder *)0x0);
  bVar2 = true;
  if (!bVar1) {
    bVar1 = LookingAt(this,"message");
    if (bVar1) {
      LocationRecorder::LocationRecorder
                (&location,root_location,4,
                 (file->message_type_).super_RepeatedPtrFieldBase.current_size_);
      message = RepeatedPtrField<google::protobuf::DescriptorProto>::Add(&file->message_type_);
      bVar2 = ParseMessageDefinition(this,message,&location,file);
    }
    else {
      bVar1 = LookingAt(this,"enum");
      if (bVar1) {
        LocationRecorder::LocationRecorder
                  (&location,root_location,5,
                   (file->enum_type_).super_RepeatedPtrFieldBase.current_size_);
        enum_type = RepeatedPtrField<google::protobuf::EnumDescriptorProto>::Add(&file->enum_type_);
        bVar2 = ParseEnumDefinition(this,enum_type,&location,file);
      }
      else {
        bVar1 = LookingAt(this,"service");
        if (bVar1) {
          LocationRecorder::LocationRecorder
                    (&location,root_location,6,
                     (file->service_).super_RepeatedPtrFieldBase.current_size_);
          service = RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::Add(&file->service_)
          ;
          bVar2 = ParseServiceDefinition(this,service,&location,file);
        }
        else {
          bVar1 = LookingAt(this,"extend");
          if (bVar1) {
            LocationRecorder::LocationRecorder(&location,root_location,7);
            bVar2 = ParseExtend(this,&file->extension_,&file->message_type_,root_location,4,
                                &location,file);
          }
          else {
            bVar1 = LookingAt(this,"import");
            if (bVar1) {
              bVar1 = ParseImport(this,&file->dependency_,&file->public_dependency_,
                                  &file->weak_dependency_,root_location,in_R9);
              return bVar1;
            }
            bVar1 = LookingAt(this,"package");
            if (bVar1) {
              bVar1 = ParsePackage(this,file,root_location,in_RCX);
              return bVar1;
            }
            bVar1 = LookingAt(this,"option");
            if (!bVar1) {
              std::__cxx11::string::string
                        ((string *)&location,"Expected top-level statement (e.g. \"message\").",
                         &local_49);
              AddError(this,(string *)&location);
              std::__cxx11::string::~string((string *)&location);
              return false;
            }
            LocationRecorder::LocationRecorder(&location,root_location,8);
            options = FileDescriptorProto::mutable_options(file);
            bVar2 = ParseOption(this,&options->super_Message,&location,file,OPTION_STATEMENT);
          }
        }
      }
    }
    LocationRecorder::~LocationRecorder(&location);
  }
  return bVar2;
}

Assistant:

bool Parser::ParseTopLevelStatement(FileDescriptorProto* file,
                                    const LocationRecorder& root_location) {
  if (TryConsumeEndOfDeclaration(";", NULL)) {
    // empty statement; ignore
    return true;
  } else if (LookingAt("message")) {
    LocationRecorder location(root_location,
      FileDescriptorProto::kMessageTypeFieldNumber, file->message_type_size());
    return ParseMessageDefinition(file->add_message_type(), location, file);
  } else if (LookingAt("enum")) {
    LocationRecorder location(root_location,
      FileDescriptorProto::kEnumTypeFieldNumber, file->enum_type_size());
    return ParseEnumDefinition(file->add_enum_type(), location, file);
  } else if (LookingAt("service")) {
    LocationRecorder location(root_location,
      FileDescriptorProto::kServiceFieldNumber, file->service_size());
    return ParseServiceDefinition(file->add_service(), location, file);
  } else if (LookingAt("extend")) {
    LocationRecorder location(root_location,
        FileDescriptorProto::kExtensionFieldNumber);
    return ParseExtend(file->mutable_extension(),
                       file->mutable_message_type(),
                       root_location,
                       FileDescriptorProto::kMessageTypeFieldNumber,
                       location, file);
  } else if (LookingAt("import")) {
    return ParseImport(file->mutable_dependency(),
                       file->mutable_public_dependency(),
                       file->mutable_weak_dependency(),
                       root_location, file);
  } else if (LookingAt("package")) {
    return ParsePackage(file, root_location, file);
  } else if (LookingAt("option")) {
    LocationRecorder location(root_location,
        FileDescriptorProto::kOptionsFieldNumber);
    return ParseOption(file->mutable_options(), location, file,
                       OPTION_STATEMENT);
  } else {
    AddError("Expected top-level statement (e.g. \"message\").");
    return false;
  }
}